

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O0

shared_ptr<LToken> __thiscall LLexer::from_string(LLexer *this,string *token)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<LToken> sVar3;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  string *token_local;
  LLexer *this_local;
  
  token_local = token;
  this_local = this;
  bVar1 = std::operator==(in_RDX,"break");
  if (bVar1) {
    local_28._M_allocated_capacity._4_4_ = 4;
    sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                      ((LNodeType *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&local_28 + 4));
    _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    bVar1 = std::operator==(in_RDX,"do");
    if (bVar1) {
      local_28._M_allocated_capacity._0_4_ = 6;
      sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                        ((LNodeType *)this,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_28);
      _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      bVar1 = std::operator==(in_RDX,"else");
      if (bVar1) {
        local_30._4_4_ = 7;
        sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                          ((LNodeType *)this,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_30 + 4));
        _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      else {
        bVar1 = std::operator==(in_RDX,"end");
        if (bVar1) {
          local_30._0_4_ = 8;
          sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                            ((LNodeType *)this,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
          _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        }
        else {
          bVar1 = std::operator==(in_RDX,"for");
          if (bVar1) {
            local_38._4_4_ = 0xd;
            sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                              ((LNodeType *)this,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_38 + 4));
            _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
          else {
            bVar1 = std::operator==(in_RDX,"function");
            if (bVar1) {
              local_38._0_4_ = 0xe;
              sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                ((LNodeType *)this,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_38);
              _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ;
            }
            else {
              bVar1 = std::operator==(in_RDX,"if");
              if (bVar1) {
                local_40._4_4_ = 0x11;
                sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                  ((LNodeType *)this,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_40 + 4));
                _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              }
              else {
                bVar1 = std::operator==(in_RDX,"in");
                if (bVar1) {
                  local_40._0_4_ = 0x12;
                  sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                    ((LNodeType *)this,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40);
                  _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
                }
                else {
                  bVar1 = std::operator==(in_RDX,"return");
                  if (bVar1) {
                    local_48._4_4_ = 0x19;
                    sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                      ((LNodeType *)this,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_48 + 4));
                    _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi;
                  }
                  else {
                    bVar1 = std::operator==(in_RDX,"then");
                    if (bVar1) {
                      local_48._0_4_ = 0x1b;
                      sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                        ((LNodeType *)this,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_48);
                      _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                    }
                    else {
                      bVar1 = std::operator==(in_RDX,"to");
                      if (bVar1) {
                        local_50._4_4_ = 0x1c;
                        sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                          ((LNodeType *)this,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(local_50 + 4));
                        _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                      }
                      else {
                        bVar1 = std::operator==(in_RDX,"while");
                        if (bVar1) {
                          local_50._0_4_ = 0x1e;
                          sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                            ((LNodeType *)this,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_50);
                          _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                        }
                        else {
                          bVar1 = std::operator==(in_RDX,"yield");
                          if (bVar1) {
                            local_58._4_4_ = 0x1f;
                            sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                              ((LNodeType *)this,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(local_58 + 4));
                            _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi;
                          }
                          else {
                            local_58._0_4_ = 0x1d;
                            sVar3 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                                              ((LNodeType *)this,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_58);
                            _Var2 = sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LToken>)sVar3.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LToken> LLexer::from_string(std::string token) {
    if (token == "break")
        return std::make_shared<LToken>(LNodeType::BREAK, std::move(token));
    if (token == "do")
        return std::make_shared<LToken>(LNodeType::DO, std::move(token));
    if (token == "else")
        return std::make_shared<LToken>(LNodeType::ELSE, std::move(token));
    if (token == "end")
        return std::make_shared<LToken>(LNodeType::END, std::move(token));
    if (token == "for")
        return std::make_shared<LToken>(LNodeType::FOR, std::move(token));
    if (token == "function")
        return std::make_shared<LToken>(LNodeType::FUNCTION, std::move(token));
    if (token == "if")
        return std::make_shared<LToken>(LNodeType::IF, std::move(token));
    if (token == "in")
        return std::make_shared<LToken>(LNodeType::IN, std::move(token));
    if (token == "return")
        return std::make_shared<LToken>(LNodeType::RETURN, std::move(token));
    if (token == "then")
        return std::make_shared<LToken>(LNodeType::THEN, std::move(token));
    if (token == "to")
        return std::make_shared<LToken>(LNodeType::TO, std::move(token));
    if (token == "while")
        return std::make_shared<LToken>(LNodeType::WHILE, std::move(token));
    if (token == "yield")
        return std::make_shared<LToken>(LNodeType::YIELD, std::move(token));
    return std::make_shared<LToken>(LNodeType::VAR, std::move(token));
}